

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O2

int Lodtalk::Float::stFractionPart(InterpreterProxy *interpreter)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double __x;
  Oop v;
  double integerPart;
  anon_union_8_4_0eb573b0_for_Oop_0 local_18;
  double local_10;
  
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar2;
  }
  local_18._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  local_18.uintValue._4_4_ = extraout_var_00;
  bVar1 = Oop::isFloatOrInt((Oop *)&local_18);
  if (bVar1) {
    __x = Oop::decodeFloatOrInt((Oop *)&local_18);
    modf(__x,&local_10);
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0x14])(interpreter);
  }
  else {
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
  }
  return iVar2;
}

Assistant:

int Float::stFractionPart(InterpreterProxy *interpreter)
{
    if (interpreter->getArgumentCount() != 0)
        return interpreter->primitiveFailed();

    auto v = interpreter->getReceiver();
    if (!v.isFloatOrInt())
        return interpreter->primitiveFailed();

    auto fv = v.decodeFloatOrInt();
    double fractPart, integerPart;
    fractPart = modf(fv, &integerPart);
    return interpreter->returnFloat(fractPart);
}